

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O2

int aom_img_set_rect(aom_image_t *img,uint x,uint y,uint w,uint h,uint border)

{
  uint uVar1;
  aom_img_fmt_t aVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uchar *puVar10;
  long lVar11;
  
  iVar3 = -1;
  iVar4 = -1;
  if (((!CARRY4(w,x)) && (iVar4 = iVar3, !CARRY4(h,y))) && (w + x <= img->w)) {
    uVar1 = img->h;
    if (h + y <= uVar1) {
      img->d_w = w;
      img->d_h = h;
      uVar9 = x + border;
      uVar8 = y + border;
      aVar2 = img->fmt;
      puVar10 = img->img_data;
      if ((aVar2 >> 8 & 1) == 0) {
        puVar10 = puVar10 + (ulong)(uVar9 * img->bps >> 3) + (ulong)(uVar8 * img->stride[0]);
        lVar5 = 0x40;
      }
      else {
        bVar6 = (byte)(aVar2 >> 0xb) & 1;
        lVar5 = ((ulong)(border * 2) + (ulong)uVar1) * (long)img->stride[0];
        img->planes[0] = puVar10 + (ulong)(uVar9 << bVar6) + (ulong)(img->stride[0] * uVar8);
        uVar9 = uVar9 >> ((byte)img->x_chroma_shift & 0x1f);
        bVar7 = (byte)img->y_chroma_shift;
        uVar8 = uVar8 >> (bVar7 & 0x1f);
        if (aVar2 == AOM_IMG_FMT_NV12) {
          img->planes[1] = puVar10 + (ulong)(uVar8 * img->stride[1]) + (ulong)(uVar9 * 2) + lVar5;
          lVar5 = 0x50;
          puVar10 = (uchar *)0x0;
        }
        else {
          lVar5 = (ulong)(uVar9 << bVar6) + lVar5;
          lVar11 = (ulong)((border >> (bVar7 & 0x1f)) * 2) + (ulong)(uVar1 >> (bVar7 & 0x1f));
          if ((aVar2 >> 9 & 1) == 0) {
            iVar4 = img->stride[1];
            img->planes[1] = puVar10 + (ulong)(iVar4 * uVar8) + lVar5;
            puVar10 = puVar10 + (ulong)(uVar8 * img->stride[2]) + lVar11 * iVar4 + lVar5;
            lVar5 = 0x50;
          }
          else {
            iVar4 = img->stride[2];
            img->planes[2] = puVar10 + (ulong)(iVar4 * uVar8) + lVar5;
            puVar10 = puVar10 + (ulong)(uVar8 * img->stride[1]) + lVar11 * iVar4 + lVar5;
            lVar5 = 0x48;
          }
        }
      }
      *(uchar **)((long)img->planes + lVar5 + -0x40) = puVar10;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int aom_img_set_rect(aom_image_t *img, unsigned int x, unsigned int y,
                     unsigned int w, unsigned int h, unsigned int border) {
  if (x <= UINT_MAX - w && x + w <= img->w && y <= UINT_MAX - h &&
      y + h <= img->h) {
    img->d_w = w;
    img->d_h = h;

    x += border;
    y += border;

    /* Calculate plane pointers */
    if (!(img->fmt & AOM_IMG_FMT_PLANAR)) {
      img->planes[AOM_PLANE_PACKED] =
          img->img_data + x * img->bps / 8 + y * img->stride[AOM_PLANE_PACKED];
    } else {
      const int bytes_per_sample =
          (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;
      unsigned char *data = img->img_data;

      img->planes[AOM_PLANE_Y] =
          data + x * bytes_per_sample + y * img->stride[AOM_PLANE_Y];
      data += ((size_t)img->h + 2 * border) * img->stride[AOM_PLANE_Y];

      unsigned int uv_border_h = border >> img->y_chroma_shift;
      unsigned int uv_x = x >> img->x_chroma_shift;
      unsigned int uv_y = y >> img->y_chroma_shift;
      if (img->fmt == AOM_IMG_FMT_NV12) {
        img->planes[AOM_PLANE_U] = data + uv_x * bytes_per_sample * 2 +
                                   uv_y * img->stride[AOM_PLANE_U];
        img->planes[AOM_PLANE_V] = NULL;
      } else if (!(img->fmt & AOM_IMG_FMT_UV_FLIP)) {
        img->planes[AOM_PLANE_U] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_U];
        data += ((size_t)(img->h >> img->y_chroma_shift) + 2 * uv_border_h) *
                img->stride[AOM_PLANE_U];
        img->planes[AOM_PLANE_V] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_V];
      } else {
        img->planes[AOM_PLANE_V] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_V];
        data += ((size_t)(img->h >> img->y_chroma_shift) + 2 * uv_border_h) *
                img->stride[AOM_PLANE_V];
        img->planes[AOM_PLANE_U] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_U];
      }
    }
    return 0;
  }
  return -1;
}